

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerJson.cxx
# Opt level: O1

void __thiscall
cmDebugServerJson::cmDebugServerJson(cmDebugServerJson *this,cmDebugger *debugger,int port)

{
  cmTcpIpConnection *this_00;
  cmConnectionBufferStrategy *bufferStrategy;
  
  this_00 = (cmTcpIpConnection *)operator_new(0x70);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy->_vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[3]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy[4]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_006faa90;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmTcpIpConnection::cmTcpIpConnection(this_00,port,bufferStrategy);
  cmDebugServer::cmDebugServer(&this->super_cmDebugServer,debugger,(cmConnection *)this_00);
  (this->super_cmDebugServer).super_cmServerBase._vptr_cmServerBase =
       (_func_int **)&PTR__cmDebugServerJson_006f9d58;
  (this->super_cmDebugServer).super_cmDebuggerListener._vptr_cmDebuggerListener =
       (_func_int **)&PTR__cmDebugServerJson_006f9dc8;
  return;
}

Assistant:

cmDebugServerJson::cmDebugServerJson(cmDebugger& debugger, int port)
  : cmDebugServerJson(
      debugger, new cmTcpIpConnection(port, new cmServerBufferStrategy()))
{
}